

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxValues
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *side,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minRes,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxRes,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minVal,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxVal)

{
  bool bVar1;
  byte bVar2;
  type_conflict5 tVar3;
  element_type *peVar4;
  ulong *puVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RCX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R9;
  cpp_dec_float<200U,_int,_void> *this_00;
  undefined8 in_stack_00000010;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff0f8;
  undefined7 in_stack_fffffffffffff100;
  undefined1 in_stack_fffffffffffff107;
  double in_stack_fffffffffffff108;
  undefined1 *val_00;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff110;
  undefined1 local_ea8 [24];
  double in_stack_fffffffffffff170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff180;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff188;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff190;
  undefined1 local_e28 [128];
  undefined1 local_da8 [128];
  ulong local_d28;
  undefined1 local_d20 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ca0;
  undefined1 local_c20 [128];
  ulong local_ba0;
  undefined1 local_b98 [128];
  undefined1 local_b18 [128];
  undefined1 local_a98 [16];
  undefined8 local_a88;
  undefined1 local_a80 [128];
  undefined1 local_a00 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_980;
  undefined1 local_900 [128];
  undefined1 local_880 [128];
  undefined1 local_800 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_780;
  undefined1 local_700 [128];
  ulong local_680;
  undefined1 local_678 [128];
  ulong local_5f8;
  undefined1 local_5ec [156];
  undefined8 local_550;
  undefined1 local_548 [128];
  undefined1 local_4c8 [128];
  undefined4 local_448;
  undefined4 local_444 [13];
  undefined8 local_410;
  undefined8 *local_408;
  undefined1 *local_400;
  undefined8 local_3f8;
  ulong *local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  ulong *local_3d8;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined8 *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined1 *local_370;
  undefined8 local_368;
  ulong *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  ulong *local_348;
  undefined1 *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined1 *local_328;
  undefined4 *local_320;
  undefined8 local_318;
  undefined4 *local_310;
  undefined1 *local_2f8;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b0;
  undefined1 *local_2a0;
  undefined8 local_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 *local_280;
  undefined1 *local_270;
  undefined4 *local_260;
  undefined4 *local_258;
  undefined8 local_250;
  ulong *local_248;
  ulong *local_240;
  undefined8 local_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 local_220;
  ulong *local_218;
  ulong *local_210;
  undefined8 *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined1 *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_444[0] = 0;
  local_310 = local_444;
  local_260 = local_310;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
             (long_long_type)in_stack_fffffffffffff0f8);
  local_448 = 0;
  local_318 = in_stack_00000010;
  local_320 = &local_448;
  local_258 = local_320;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
             (long_long_type)in_stack_fffffffffffff0f8);
  local_2f8 = local_4c8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
             (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
  local_550 = 0;
  local_400 = local_548;
  local_408 = &local_550;
  local_410 = 0;
  local_208 = local_408;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff110,in_stack_fffffffffffff108,
             (type *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff0f8);
  peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x748106);
  Tolerances::epsilon(peVar4);
  bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (in_stack_fffffffffffff190,in_stack_fffffffffffff188,
                     (double)in_stack_fffffffffffff180);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x748144);
  if (bVar1) {
    puVar5 = (ulong *)infinity();
    local_5f8 = *puVar5 ^ 0x8000000000000000;
    local_3e8 = local_5ec;
    local_3f0 = &local_5f8;
    local_3f8 = 0;
    local_210 = local_3f0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff110,in_stack_fffffffffffff108,
               (type *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
    tVar3 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff0f8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x7481e5);
    if (tVar3) {
      puVar5 = (ulong *)infinity();
      local_680 = *puVar5 ^ 0x8000000000000000;
      local_3d0 = local_678;
      local_3d8 = &local_680;
      local_3e0 = 0;
      local_218 = local_3d8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (type *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
      local_270 = local_678;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
    }
    else {
      local_28 = &local_780;
      local_38 = in_R8;
      local_30 = in_RDX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,in_RDX,in_R8);
      local_20 = &local_780;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
      local_8 = &local_780;
      local_10 = local_30;
      local_18 = local_38;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                 (cpp_dec_float<200U,_int,_void> *)0x748381);
      local_128 = local_700;
      local_130 = &local_780;
      local_138 = in_RCX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_139,local_130,in_RCX);
      local_120 = local_700;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
      local_108 = local_700;
      local_110 = local_130;
      local_118 = local_138;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                 (cpp_dec_float<200U,_int,_void> *)0x748435);
      local_280 = local_700;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
    }
    local_3c0 = infinity();
    local_3b8 = local_800;
    local_3c8 = 0;
    local_220 = local_3c0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff110,in_stack_fffffffffffff108,
               (type *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
    tVar3 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff0f8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x7484d2);
    if (tVar3) {
      local_3a8 = infinity();
      local_3a0 = local_880;
      local_3b0 = 0;
      local_228 = local_3a8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (type *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
      local_288 = in_stack_00000010;
      local_290 = local_880;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
    }
    else {
      local_68 = &local_980;
      local_78 = in_R9;
      local_70 = in_RDX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,in_RDX,in_R9);
      local_60 = &local_980;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
      local_48 = &local_980;
      local_50 = local_70;
      local_58 = local_78;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                 (cpp_dec_float<200U,_int,_void> *)0x74861c);
      local_168 = local_900;
      local_170 = &local_980;
      local_178 = in_RCX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_179,local_170,in_RCX);
      local_160 = local_900;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
      local_148 = local_900;
      local_150 = local_170;
      local_158 = local_178;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                 (cpp_dec_float<200U,_int,_void> *)0x7486d0);
      local_298 = in_stack_00000010;
      local_2a0 = local_900;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
    }
  }
  else {
    local_2e8 = local_a00;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100),
               (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
    local_a88 = 0;
    local_388 = local_a80;
    local_390 = &local_a88;
    local_398 = 0;
    local_230 = local_390;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff110,in_stack_fffffffffffff108,
               (type *)CONCAT17(in_stack_fffffffffffff107,in_stack_fffffffffffff100));
    val_00 = local_a98;
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff0f8);
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x7487c2);
    this_00 = (cpp_dec_float<200U,_int,_void> *)Tolerances::epsilon(peVar4);
    bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170
                      );
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x748800);
    if ((bVar2 & 1) != 0) {
      local_378 = infinity();
      local_370 = local_b18;
      local_380 = 0;
      local_238 = local_378;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (this_00,(double)val_00,(type *)CONCAT17(bVar2,in_stack_fffffffffffff100));
      tVar3 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff0f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x748875);
      if (tVar3) {
        puVar5 = (ulong *)infinity();
        local_ba0 = *puVar5 ^ 0x8000000000000000;
        local_358 = local_b98;
        local_360 = &local_ba0;
        local_368 = 0;
        local_240 = local_360;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (this_00,(double)val_00,(type *)CONCAT17(bVar2,in_stack_fffffffffffff100));
        local_2b0 = local_b98;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
      }
      else {
        local_a8 = &local_ca0;
        local_b8 = in_R9;
        local_b0 = in_RDX;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,in_RDX,in_R9);
        local_a0 = &local_ca0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100));
        local_88 = &local_ca0;
        local_90 = local_b0;
        local_98 = local_b8;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                   (cpp_dec_float<200U,_int,_void> *)0x748a11);
        local_1a8 = local_c20;
        local_1b0 = &local_ca0;
        local_1b8 = in_RCX;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_1b9,local_1b0,in_RCX);
        local_1a0 = local_c20;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100));
        local_188 = local_c20;
        local_190 = local_1b0;
        local_198 = local_1b8;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                   (cpp_dec_float<200U,_int,_void> *)0x748ac5);
        local_2c0 = local_c20;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
      }
      puVar5 = (ulong *)infinity();
      local_d28 = *puVar5 ^ 0x8000000000000000;
      local_340 = local_d20;
      local_348 = &local_d28;
      local_350 = 0;
      local_248 = local_348;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (this_00,(double)val_00,(type *)CONCAT17(bVar2,in_stack_fffffffffffff100));
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff0f8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x748b8e);
      if (tVar3) {
        local_330 = infinity();
        local_328 = local_da8;
        local_338 = 0;
        local_250 = local_330;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (this_00,(double)val_00,(type *)CONCAT17(bVar2,in_stack_fffffffffffff100));
        local_2c8 = in_stack_00000010;
        local_2d0 = local_da8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
      }
      else {
        local_e8 = local_ea8;
        local_f8 = in_R8;
        local_f0 = in_RDX;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_f9,in_RDX,in_R8);
        local_e0 = local_ea8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100));
        local_c8 = local_ea8;
        local_d0 = local_f0;
        local_d8 = local_f8;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                   (cpp_dec_float<200U,_int,_void> *)0x748ccf);
        local_1e8 = local_e28;
        local_1f0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_ea8;
        local_1f8 = in_RCX;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_1f9,local_1f0,in_RCX);
        local_1e0 = local_e28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100));
        local_1c8 = local_e28;
        local_1d0 = local_1f0;
        local_1d8 = local_1f8;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8,
                   (cpp_dec_float<200U,_int,_void> *)0x748d80);
        local_2d8 = in_stack_00000010;
        local_2e0 = local_e28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT17(bVar2,in_stack_fffffffffffff100),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff0f8);
      }
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}